

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigReference.cpp
# Opt level: O3

bool deqp::egl::operator==(SurfaceConfig *a,SurfaceConfig *b)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color attribute;
  deInt32 dVar2;
  deInt32 dVar3;
  _Base_ptr p_Var4;
  _Self __tmp;
  bool bVar5;
  map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
  defaultRules;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_deqp::egl::AttribRule>,_std::_Select1st<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
  local_60;
  
  SurfaceConfig::getDefaultRules();
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left == p_Var1) {
    bVar5 = true;
  }
  else {
    p_Var4 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      attribute = p_Var4[1]._M_color;
      dVar2 = eglu::ConfigInfo::getAttribute(&a->m_info,attribute);
      dVar3 = eglu::ConfigInfo::getAttribute(&b->m_info,attribute);
      bVar5 = dVar2 == dVar3;
      if (!bVar5) break;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var1);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_deqp::egl::AttribRule>,_std::_Select1st<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
  ::~_Rb_tree(&local_60);
  return bVar5;
}

Assistant:

bool operator== (const SurfaceConfig& a, const SurfaceConfig& b)
	{
		const std::map<EGLenum, AttribRule> defaultRules = getDefaultRules();

		for (std::map<EGLenum, AttribRule>::const_iterator iter = defaultRules.begin(); iter != defaultRules.end(); iter++)
		{
			const EGLenum attribute = iter->first;

			if (a.getAttribute(attribute) != b.getAttribute(attribute)) return false;
		}
		return true;
	}